

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_sock_add_stat(nni_sock *s,nni_stat_item *stat)

{
  nni_stat_item *stat_local;
  nni_sock *s_local;
  
  nni_stat_add(&s->st_root,stat);
  return;
}

Assistant:

void
nni_sock_add_stat(nni_sock *s, nni_stat_item *stat)
{
#ifdef NNG_ENABLE_STATS
	nni_stat_add(&s->st_root, stat);
#else
	NNI_ARG_UNUSED(s);
	NNI_ARG_UNUSED(stat);
#endif
}